

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkDynamicState * __thiscall
Fossilize::StateRecorder::Impl::copy<VkDynamicState>
          (Impl *this,VkDynamicState *src,size_t count,ScratchAllocator *alloc)

{
  VkDynamicState *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkDynamicState>(alloc,count);
    if (pVVar1 != (VkDynamicState *)0x0) {
      pVVar1 = (VkDynamicState *)memmove(pVVar1,src,count << 2);
      return pVVar1;
    }
  }
  return (VkDynamicState *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}